

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

int Cec_ManLoadCounterExamples(Vec_Ptr_t *vInfo,Vec_Int_t *vCexStore,int iStart)

{
  int iVar1;
  int nLits;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p;
  int *piVar6;
  void **__ptr;
  long lVar7;
  Vec_Ptr_t *vPres;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int i;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint local_64;
  
  iVar8 = vInfo->nSize;
  lVar14 = (long)iVar8;
  if (lVar14 < 2) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar2 = vInfo->pArray[1];
  pvVar3 = *vInfo->pArray;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar6 = (int *)malloc(400);
  p->pArray = piVar6;
  iVar11 = (int)((ulong)((long)pvVar2 - (long)pvVar3) >> 2);
  __ptr = (void **)malloc(((long)iVar11 * 4 + 8) * lVar14);
  lVar7 = lVar14 * 8;
  lVar9 = 0;
  do {
    __ptr[lVar9] = (void *)((long)__ptr + lVar7);
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + (long)iVar11 * 4;
  } while (lVar14 != lVar9);
  vPres = (Vec_Ptr_t *)malloc(0x10);
  vPres->nSize = iVar8;
  vPres->nCap = iVar8;
  vPres->pArray = __ptr;
  lVar7 = 0;
  do {
    memset(__ptr[lVar7],0,(long)(iVar11 * 4));
    lVar7 = lVar7 + 1;
  } while (lVar14 != lVar7);
  iVar4 = iVar11 * 0x20;
  local_64 = iStart;
  iVar8 = 2;
  if (2 < iVar4) {
    iVar8 = iVar4;
  }
LAB_00640b84:
  uVar13 = local_64;
  while ((int)uVar13 < vCexStore->nSize) {
    if (((int)local_64 < -1) || (vCexStore->nSize <= (int)(uVar13 + 1))) goto LAB_00640cc7;
    iVar1 = vCexStore->pArray[uVar13 + 1];
    uVar13 = uVar13 + 2;
    if (0 < iVar1) goto code_r0x00640bbe;
  }
  goto LAB_00640c70;
code_r0x00640bbe:
  p->nSize = 0;
  uVar10 = (ulong)uVar13;
  local_64 = uVar13 + iVar1;
  iVar12 = 0;
  do {
    if (((int)uVar13 < 0) || (vCexStore->nSize <= (int)(uVar13 + iVar12))) {
LAB_00640cc7:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    Vec_IntPush(p,vCexStore->pArray[uVar10]);
    iVar12 = iVar12 + 1;
    uVar10 = uVar10 + 1;
  } while (iVar1 != iVar12);
  if (iVar11 < 1) {
    iVar12 = 1;
  }
  else {
    piVar6 = p->pArray;
    nLits = p->nSize;
    iVar12 = 1;
    do {
      iVar5 = Cec_ManLoadCounterExamplesTry(vInfo,vPres,iVar12,piVar6,nLits);
      if (iVar5 != 0) break;
      iVar12 = iVar12 + 1;
    } while (iVar8 != iVar12);
  }
  if (iVar12 == iVar4 + -1) {
    uVar13 = iVar1 + uVar13;
LAB_00640c70:
    if (__ptr != (void **)0x0) {
      free(__ptr);
      vPres->pArray = (void **)0x0;
    }
    free(vPres);
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    free(p);
    return uVar13;
  }
  goto LAB_00640b84;
}

Assistant:

int Cec_ManLoadCounterExamples( Vec_Ptr_t * vInfo, Vec_Int_t * vCexStore, int iStart )
{ 
    Vec_Int_t * vPat;
    Vec_Ptr_t * vPres;
    int nWords = Vec_PtrReadWordsSimInfo(vInfo);
    int nBits = 32 * nWords; 
    int k, nSize, kMax = 0;//, iBit = 1;
    vPat  = Vec_IntAlloc( 100 );
    vPres = Vec_PtrAllocSimInfo( Vec_PtrSize(vInfo), nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        // skip the output number
        iStart++;
        // get the number of items
        nSize = Vec_IntEntry( vCexStore, iStart++ );
        if ( nSize <= 0 )
            continue;
        // extract pattern
        Vec_IntClear( vPat );
        for ( k = 0; k < nSize; k++ )
            Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
        // add pattern to storage
        for ( k = 1; k < nBits; k++ )
            if ( Cec_ManLoadCounterExamplesTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;
        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
            break;
    }
    Vec_PtrFree( vPres );
    Vec_IntFree( vPat );
    return iStart;
}